

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mldsa_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_5f4c02::MLDSATest_Basic87_Test::~MLDSATest_Basic87_Test
          (MLDSATest_Basic87_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MLDSATest, Basic87) {
  MLDSABasicTest<MLDSA87_private_key, MLDSA87_public_key,
                 BCM_MLDSA87_PUBLIC_KEY_BYTES, BCM_MLDSA87_SIGNATURE_BYTES,
                 MLDSA87_generate_key, MLDSA87_sign, MLDSA87_parse_public_key,
                 MLDSA87_verify, MLDSA87_private_key_from_seed,
                 BCM_mldsa87_private_key, BCM_mldsa87_parse_private_key,
                 BCM_mldsa87_marshal_private_key>();
}